

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::BindPrivate
          (Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *this,
          string_view *name,MemberFunction *func,bool required)

{
  MemberFunction *this_00;
  Member local_58;
  
  this_00 = &local_58.Function;
  local_58.Function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.Function._M_invoker = (_Invoker_type)0x0;
  local_58.Function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.Function.super__Function_base._M_functor._8_8_ = 0;
  local_58.Name._M_len = name->_M_len;
  local_58.Name._M_str = name->_M_str;
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions_&,_const_Json::Value_*)>
  ::operator=(this_00,func);
  local_58.Required = required;
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::Member>_>
  ::
  emplace_back<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::Member>
            (&this->Members,&local_58);
  if (required) {
    this->AnyRequired = true;
  }
  if (local_58.Function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.Function.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }